

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.h
# Opt level: O3

int __thiscall IClient::SendPackMsg<CNetMsg_Cl_Vote>(IClient *this,CNetMsg_Cl_Vote *pMsg,int Flags)

{
  int iVar1;
  long in_FS_OFFSET;
  CMsgPacker Packer;
  CPacker local_840;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  CPacker::Reset(&local_840);
  CPacker::AddInt(&local_840,0x3e);
  CPacker::AddInt(&local_840,pMsg->m_Vote);
  iVar1 = -1;
  if (local_840.m_Error == 0) {
    iVar1 = (*(this->super_IInterface)._vptr_IInterface[0x24])(this,&local_840,(ulong)(uint)Flags);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int SendPackMsg(T *pMsg, int Flags)
	{
		CMsgPacker Packer(pMsg->MsgID(), false);
		if(pMsg->Pack(&Packer))
			return -1;
		return SendMsg(&Packer, Flags);
	}